

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::TexelFetchDecodeSkippedcase::verifyResult
          (TexelFetchDecodeSkippedcase *this)

{
  TestLog *pTVar1;
  bool bVar2;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> pixelResultList;
  Vec4 pixelReference;
  Vec4 pixelExpected;
  Vector<bool,_4> local_220;
  Vector<bool,_4> local_21c;
  Vector<float,_4> local_218 [2];
  _Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_1f8;
  _func_int **local_1d8;
  TestContext *pTStack_1d0;
  _func_int **local_1c8;
  TestContext *pTStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  Vector<float,_4> local_1a8;
  undefined1 local_198 [8];
  TestContext *pTStack_190;
  
  pTVar1 = ((this->super_SRGBTestCase).super_TestCase.m_context)->m_testCtx->m_log;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (Vector<float,_4> *)0x0;
  local_1f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_1d8);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_1c8);
  SRGBTestCase::readResultTextures(&this->super_SRGBTestCase);
  SRGBTestCase::storeResultPixels
            (&this->super_SRGBTestCase,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_1f8);
  local_1b8 = 0x3e99999a3e4ccccd;
  uStack_1b0 = 0x3f8000003ecccccd;
  SRGBTestCase::formatReferenceColor((SRGBTestCase *)local_198,(Vec4 *)this);
  local_1c8 = (_func_int **)local_198;
  pTStack_1c0 = pTStack_190;
  local_1d8 = (_func_int **)local_198;
  pTStack_1d0 = pTStack_190;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_198,"Expected color: ",(allocator<char> *)local_218);
  tcu::Vector<float,_4>::Vector(&local_1a8,(Vector<float,_4> *)&local_1c8);
  SRGBTestCase::logColor(&this->super_SRGBTestCase,(string *)local_198,0,&local_1a8);
  std::__cxx11::string::~string((string *)local_198);
  tcu::operator-((tcu *)local_218,local_1f8._M_impl.super__Vector_impl_data._M_start,
                 (Vector<float,_4> *)&local_1d8);
  tcu::abs<float,4>((tcu *)local_198,local_218);
  tcu::lessThan<float,4>
            ((tcu *)&local_220,(Vector<float,_4> *)local_198,
             &(this->super_SRGBTestCase).m_epsilonError);
  bVar2 = tcu::boolAll<4>(&local_220);
  local_198 = (undefined1  [8])pTVar1;
  if (!bVar2) {
    tcu::equal<float,4>((tcu *)&local_21c,local_1f8._M_impl.super__Vector_impl_data._M_start,
                        (Vector<float,_4> *)&local_1d8);
    bVar2 = tcu::boolAll<4>(&local_21c);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pTStack_190);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_218,"not linear as expected",(allocator<char> *)&local_220);
      std::operator<<((ostream *)&pTStack_190,(string *)local_218);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)local_218);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pTStack_190);
      bVar2 = false;
      goto LAB_0125d7fd;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pTStack_190);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_218,"linear as expected",(allocator<char> *)&local_220);
  std::operator<<((ostream *)&pTStack_190,(string *)local_218);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)local_218);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pTStack_190);
  bVar2 = true;
LAB_0125d7fd:
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&local_1f8);
  return bVar2;
}

Assistant:

bool TexelFetchDecodeSkippedcase::verifyResult (void)
{
	tcu::TestLog&			log				= m_context.getTestContext().getLog();
	const int				resultColorIdx	= 0;
	std::vector<tcu::Vec4>	pixelResultList;
	tcu::Vec4				pixelReference;
	tcu::Vec4				pixelExpected;

	this->readResultTextures();
	this->storeResultPixels(pixelResultList);

	pixelReference = pixelExpected = this->formatReferenceColor(getColorReferenceLinear());

	this->logColor(std::string("Expected color: "), resultColorIdx, pixelExpected);

	// result color 0 should be linear due to automatic conversion via texelFetch*(). Compare with linear reference color
	if ( (tcu::boolAll(tcu::lessThan(tcu::abs(pixelResultList[0] - pixelReference), m_epsilonError))) || (tcu::boolAll(tcu::equal(pixelResultList[0], pixelReference))) )
	{
		log << tcu::TestLog::Message << std::string("linear as expected") << tcu::TestLog::EndMessage;
		return true;
	}
	else
	{
		log << tcu::TestLog::Message << std::string("not linear as expected") << tcu::TestLog::EndMessage;
		return false;
	}
}